

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

int aes_init_dec(aes_context *ctx,uint8_t *key,int bits)

{
  uint uVar1;
  int iVar2;
  aes_context *paVar3;
  long lVar4;
  long lVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  aes_context enc;
  aes_context aStack_128;
  
  if (bits == 0x80) {
    iVar2 = 10;
  }
  else {
    if (bits != 0x100) {
      return -1;
    }
    iVar2 = 0xe;
  }
  ctx->nr = iVar2;
  iVar2 = aes_init(&aStack_128,key,bits);
  if (iVar2 < 0) {
    iVar2 = -1;
  }
  else {
    lVar4 = (long)ctx->nr;
    paVar3 = (aes_context *)(aStack_128.key + lVar4 * 4 + -4);
    ctx->key[0] = aStack_128.key[lVar4 * 4];
    ctx->key[1] = aStack_128.key[lVar4 * 4 + 1];
    ctx->key[2] = aStack_128.key[lVar4 * 4 + 2];
    ctx->key[3] = aStack_128.key[lVar4 * 4 + 3];
    puVar7 = ctx->key + 4;
    lVar5 = lVar4 + -1;
    if ((int)lVar5 == 0) {
      puVar6 = aStack_128.key + lVar4 * 4;
    }
    else {
      do {
        puVar6 = (uint32_t *)paVar3;
        uVar1 = *puVar6;
        *puVar7 = (TD[Te[(ulong)uVar1 & 0xff]] << 8 | TD[Te[(ulong)uVar1 & 0xff]] >> 0x18) ^
                  (TD[Te[uVar1 >> 8 & 0xff]] << 0x10 | TD[Te[uVar1 >> 8 & 0xff]] >> 0x10) ^
                  (TD[Te[uVar1 >> 0x10 & 0xff]] << 0x18 | TD[Te[uVar1 >> 0x10 & 0xff]] >> 8) ^
                  TD[Te[uVar1 >> 0x18]];
        uVar1 = puVar6[1];
        puVar7[1] = (TD[Te[(ulong)uVar1 & 0xff]] << 8 | TD[Te[(ulong)uVar1 & 0xff]] >> 0x18) ^
                    (TD[Te[uVar1 >> 8 & 0xff]] << 0x10 | TD[Te[uVar1 >> 8 & 0xff]] >> 0x10) ^
                    (TD[Te[uVar1 >> 0x10 & 0xff]] << 0x18 | TD[Te[uVar1 >> 0x10 & 0xff]] >> 8) ^
                    TD[Te[uVar1 >> 0x18]];
        uVar1 = puVar6[2];
        puVar7[2] = (TD[Te[(ulong)uVar1 & 0xff]] << 8 | TD[Te[(ulong)uVar1 & 0xff]] >> 0x18) ^
                    (TD[Te[uVar1 >> 8 & 0xff]] << 0x10 | TD[Te[uVar1 >> 8 & 0xff]] >> 0x10) ^
                    (TD[Te[uVar1 >> 0x10 & 0xff]] << 0x18 | TD[Te[uVar1 >> 0x10 & 0xff]] >> 8) ^
                    TD[Te[uVar1 >> 0x18]];
        uVar1 = puVar6[3];
        puVar7[3] = (TD[Te[(ulong)uVar1 & 0xff]] << 8 | TD[Te[(ulong)uVar1 & 0xff]] >> 0x18) ^
                    (TD[Te[uVar1 >> 8 & 0xff]] << 0x10 | TD[Te[uVar1 >> 8 & 0xff]] >> 0x10) ^
                    (TD[Te[uVar1 >> 0x10 & 0xff]] << 0x18 | TD[Te[uVar1 >> 0x10 & 0xff]] >> 8) ^
                    TD[Te[uVar1 >> 0x18]];
        puVar7 = puVar7 + 4;
        paVar3 = (aes_context *)(puVar6 + -4);
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    *puVar7 = paVar3->nr;
    puVar7[1] = puVar6[-3];
    puVar7[2] = puVar6[-2];
    puVar7[3] = puVar6[-1];
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int aes_init_dec(aes_context* ctx, const uint8_t* key, int bits)
{
    switch(bits) {
        case 128: ctx->nr = 10; break;
        case 256: ctx->nr = 14; break;
        default: return -1;
    }
#if PLATFORM_SUPPORTS_AESNI
    if (aes_supported_x86())
    {
        aes_init_dec_x86(ctx, key);
        return 0;
    }
#endif

    aes_context enc;
    if (aes_init(&enc, key, bits) < 0)
        return -1;

    uint32_t* ekey = enc.key + 4 * ctx->nr;
    uint32_t* dkey = ctx->key;

    *dkey++ = ekey[0];
    *dkey++ = ekey[1];
    *dkey++ = ekey[2];
    *dkey++ = ekey[3];
    ekey -= 4;

    for (size_t i = ctx->nr - 1; i > 0; i--)
    {
        *dkey++ = setup_mix2(ekey[0]);
        *dkey++ = setup_mix2(ekey[1]);
        *dkey++ = setup_mix2(ekey[2]);
        *dkey++ = setup_mix2(ekey[3]);
        ekey -= 4;
    }

    *dkey++ = ekey[0];
    *dkey++ = ekey[1];
    *dkey++ = ekey[2];
    *dkey++ = ekey[3];
    return 0;
}